

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

int vfio_disable_msi(int device_fd)

{
  __off_t __offset;
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  size_t sVar8;
  void *pvVar9;
  int __timeout;
  epoll_event *__events;
  code *pcVar10;
  undefined4 uVar11;
  ulong uVar12;
  char *__buf;
  undefined1 *puVar13;
  undefined1 *puVar14;
  epoll_event *peVar15;
  long lVar16;
  char *pcVar17;
  char irq_set_buf [24];
  char buf [512];
  undefined8 auStack_3318 [2];
  size_t asStack_3308 [67];
  long lStack_30f0;
  int iStack_30e8;
  uint uStack_30e4;
  undefined8 uStack_30e0;
  undefined1 auStack_30d8 [512];
  stat sStack_2ed8;
  char acStack_2e48 [4096];
  char acStack_1e48 [4096];
  ulong auStack_e48 [3];
  epoll_event aeStack_e2c [33];
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  epoll_event aeStack_c08 [32];
  undefined1 auStack_a08 [8];
  ulong uStack_a00;
  undefined1 *puStack_9f8;
  char *pcStack_9f0;
  char *pcStack_9e8;
  char *pcStack_9e0;
  code *pcStack_9d8;
  ulong uStack_9d0;
  int iStack_9c8;
  undefined4 uStack_9c4;
  undefined1 auStack_9c0 [520];
  ulong uStack_7b8;
  undefined1 auStack_6e8 [512];
  code *pcStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  uint uStack_4d0;
  int iStack_4cc;
  undefined1 auStack_440 [512];
  ulong uStack_240;
  undefined1 local_208 [512];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x4b,
          "vfio_disable_msi");
  uVar5 = 0x3b6e;
  iVar2 = ioctl(device_fd,0x3b6e);
  if (iVar2 != -1) {
    return 0;
  }
  puVar13 = local_208;
  vfio_disable_msi_cold_1();
  pcStack_4e8 = (code *)0x1072c2;
  uStack_240 = (ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x60,
          "vfio_enable_msix");
  pcStack_4e8 = (code *)0x1072cb;
  iVar2 = eventfd(0,0);
  uVar3 = 0x21;
  if (uVar5 < 0x21) {
    uVar3 = uVar5;
  }
  uStack_4d0 = 1;
  if (uVar5 != 0) {
    uStack_4d0 = uVar3;
  }
  uStack_4e0 = 0x2400000098;
  uStack_4d8 = 2;
  pcStack_4e8 = (code *)0x107308;
  iStack_4cc = iVar2;
  iVar4 = ioctl((int)puVar13,0x3b6e);
  if (iVar4 != -1) {
    return iVar2;
  }
  puVar14 = auStack_440;
  pcStack_4e8 = vfio_disable_msix;
  vfio_enable_msix_cold_1();
  pcStack_4e8 = (code *)((ulong)puVar13 & 0xffffffff);
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar2 = ioctl((int)puVar14,0x3b6e);
  if (iVar2 != -1) {
    return 0;
  }
  puVar13 = auStack_6e8;
  vfio_disable_msix_cold_1();
  pcVar17 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c";
  pcStack_9d8 = (code *)0x1073e2;
  uStack_7b8 = (ulong)puVar14 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar10 = (code *)0x2;
  while( true ) {
    uVar12 = 0x3b6d;
    uStack_9d0 = 0x10;
    iVar4 = (int)pcVar10;
    uStack_9c4 = 0;
    pcStack_9d8 = (code *)0x107416;
    iStack_9c8 = iVar4;
    iVar2 = ioctl((int)puVar13,0x3b6d,&uStack_9d0);
    if (iVar2 == -1) break;
    if ((uStack_9d0 & 0x100000000) != 0) goto LAB_0010744b;
    pcStack_9d8 = (code *)0x107441;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    pcVar10 = (code *)(ulong)(iVar4 - 1);
    if (iVar4 == 0) {
      pcVar10 = (code *)0xffffffff;
LAB_0010744b:
      return (int)pcVar10;
    }
  }
  iVar2 = (int)auStack_9c0;
  pcStack_9d8 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_1();
  pcStack_9e0 = "vfio_setup_interrupt";
  pcStack_9e8 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
  ;
  pcStack_9f0 = "[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n";
  lVar1 = -((uVar12 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_c08 + lVar1);
  uStack_a00 = (ulong)puVar13 & 0xffffffff;
  puStack_9f8 = (undefined1 *)&uStack_9d0;
  pcStack_9d8 = pcVar10;
  *(undefined8 *)((long)&uStack_c10 + lVar1) = 0x1074a4;
  uVar5 = epoll_wait(iVar2,__events,(int)uVar12,__timeout);
  if (uVar5 != 0xffffffff) {
    pcVar17 = (char *)(ulong)uVar5;
    if (0 < (int)uVar5) {
      lVar16 = 0;
      do {
        iVar2 = *(int *)((long)aeStack_c08 + lVar16 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_c10 + lVar1) = 0x1074d4;
        sVar7 = read(iVar2,auStack_a08,8);
        if (sVar7 == -1) {
          *(undefined8 *)((long)&uStack_c10 + lVar1) = 0x107501;
          vfio_epoll_wait_cold_1();
          goto LAB_00107501;
        }
        lVar16 = lVar16 + 0xc;
      } while ((long)pcVar17 * 0xc != lVar16);
    }
    return uVar5;
  }
LAB_00107501:
  peVar15 = aeStack_c08;
  *(code **)((long)&uStack_c10 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_c10 + lVar1) = &pcStack_9d8;
  *(epoll_event **)((long)&uStack_c18 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_e2c + lVar1) = 1;
  *(int *)((long)aeStack_e2c + lVar1 + 4) = (int)peVar15;
  *(undefined8 *)((long)auStack_e48 + lVar1 + 0x10) = 0x10752b;
  uVar5 = epoll_create1(0);
  if (uVar5 == 0xffffffff) {
    *(undefined8 *)((long)auStack_e48 + lVar1 + 0x10) = 0x107560;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar5;
    *(undefined8 *)((long)auStack_e48 + lVar1 + 0x10) = 0x107545;
    iVar2 = epoll_ctl(uVar5,1,(int)peVar15,(epoll_event *)((long)aeStack_e2c + lVar1));
    if (iVar2 != -1) {
      return uVar5;
    }
  }
  lVar16 = (long)aeStack_e2c + lVar1 + 0xc;
  *(code **)((long)auStack_e48 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_e48 + lVar1 + 0x10) = (ulong)peVar15 & 0xffffffff;
  *(char **)((long)auStack_e48 + lVar1 + 8) = pcVar17;
  *(epoll_event **)((long)auStack_e48 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107599;
  snprintf(acStack_1e48 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar16);
  *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1075a9;
  iVar2 = stat(acStack_1e48 + lVar1,(stat *)((long)&sStack_2ed8 + lVar1));
  if (iVar2 < 0) {
    return -1;
  }
  pcVar17 = acStack_1e48 + lVar1;
  *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1075c1;
  sVar8 = strlen(pcVar17);
  *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1075d8;
  strncat(pcVar17,"iommu_group",0xfff - sVar8);
  __buf = acStack_2e48 + lVar1;
  *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1075ed;
  sVar7 = readlink(pcVar17,__buf,0x1000);
  uVar11 = SUB84(__buf,0);
  if (sVar7 == -1) {
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107782;
    vfio_init_cold_11();
LAB_00107782:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x10778c;
    vfio_init_cold_10();
LAB_0010778c:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107796;
    vfio_init_cold_8();
LAB_00107796:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077a0;
    vfio_init_cold_7();
LAB_001077a0:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077aa;
    vfio_init_cold_6();
LAB_001077aa:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077b4;
    vfio_init_cold_5();
LAB_001077b4:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077be;
    vfio_init_cold_3();
LAB_001077be:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077c8;
    vfio_init_cold_9();
LAB_001077c8:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077d2;
    vfio_init_cold_1();
LAB_001077d2:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1077dc;
    vfio_init_cold_2();
  }
  else {
    acStack_2e48[(int)sVar7 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x10760e;
    pcVar17 = __xpg_basename(acStack_2e48 + lVar1);
    uVar11 = 0x108432;
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107624;
    iVar2 = __isoc99_sscanf(pcVar17,"%d",(long)&uStack_30e4 + lVar1);
    if (iVar2 == -1) goto LAB_00107782;
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107634;
    iVar2 = get_vfio_container();
    *(int *)((long)&iStack_30e8 + lVar1) = iVar2;
    if (iVar2 == -1) {
      uVar11 = 2;
      *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107651;
      iVar4 = open("/dev/vfio/vfio",2);
      if (iVar4 == -1) goto LAB_001077be;
      *(int *)((long)&iStack_30e8 + lVar1) = iVar4;
      *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107667;
      set_vfio_container(iVar4);
      uVar11 = 0x3b64;
      *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107676;
      iVar6 = ioctl(iVar4,0x3b64);
      if (iVar6 != 0) goto LAB_001077c8;
      uVar11 = 0x3b65;
      *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107692;
      iVar4 = ioctl(iVar4,0x3b65,1);
      if (iVar4 == 1) goto LAB_0010769b;
      goto LAB_001077d2;
    }
LAB_0010769b:
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1076bd;
    snprintf(acStack_1e48 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_30e4 + lVar1)
            );
    uVar11 = 2;
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1076cc;
    iVar4 = open(acStack_1e48 + lVar1,2);
    if (iVar4 == -1) goto LAB_0010778c;
    uVar11 = 0x3b67;
    *(undefined8 *)((long)&uStack_30e0 + lVar1) = 8;
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x1076f2;
    iVar6 = ioctl(iVar4,0x3b67);
    if (iVar6 == -1) goto LAB_00107796;
    if ((auStack_30d8[lVar1 + -4] & 1) == 0) goto LAB_001077a0;
    uVar11 = 0x3b68;
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107718;
    iVar6 = ioctl(iVar4,0x3b68,(long)&iStack_30e8 + lVar1);
    if (iVar6 == -1) goto LAB_001077aa;
    if (iVar2 != -1) {
LAB_00107743:
      uVar11 = 0x3b6a;
      *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107755;
      iVar2 = ioctl(iVar4,0x3b6a,lVar16);
      if (iVar2 != -1) {
        *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x107763;
        vfio_enable_dma(iVar2);
        return iVar2;
      }
      goto LAB_001077b4;
    }
    uVar11 = 0x3b66;
    *(undefined8 *)((long)&lStack_30f0 + lVar1) = 0x10773a;
    iVar2 = ioctl(*(int *)((long)&iStack_30e8 + lVar1),0x3b66,1);
    if (iVar2 != -1) goto LAB_00107743;
  }
  iVar2 = (int)auStack_30d8 + (int)lVar1;
  *(code **)((long)&lStack_30f0 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_30f0 + lVar1) = lVar16;
  *(undefined8 *)((long)auStack_3318 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_3308 + lVar1) = 0;
  *(undefined8 *)((long)asStack_3308 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_3308 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_3308 + lVar1) = uVar11;
  *(undefined8 *)((long)auStack_3318 + lVar1) = 0x107811;
  iVar4 = ioctl(iVar2,0x3b6c);
  if (iVar4 != -1) {
    sVar8 = *(size_t *)((long)asStack_3308 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_3308 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_3318 + lVar1) = 0x107834;
    pvVar9 = mmap((void *)0x0,sVar8,3,1,iVar2,__offset);
    if (pvVar9 != (void *)0xffffffffffffffff) goto LAB_0010784b;
    *(undefined8 *)((long)auStack_3318 + lVar1) = 0x107844;
    vfio_map_region_cold_1();
  }
  pvVar9 = (void *)0xffffffffffffffff;
LAB_0010784b:
  return (int)pvVar9;
}

Assistant:

int vfio_disable_msi(int device_fd) {
	info("Disable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSI interrupts");

	return 0;
}